

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  RenameToken **ppRVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  short sVar5;
  NameContext *pNVar6;
  Parse *pParse;
  ExprList *pEVar7;
  sqlite3 *db;
  _func_void_sqlite3_context_ptr *p_Var8;
  Db *pDVar9;
  SrcList *pSVar10;
  IdList *pIVar11;
  IdList_item *pIVar12;
  Upsert *pUVar13;
  Schema *pSVar14;
  u8 uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  size_t sVar21;
  FuncDef *pFunc;
  Expr *pEVar22;
  Select *pSVar23;
  RenameToken *pRVar24;
  Window *pWVar25;
  ushort uVar26;
  ulong uVar27;
  Expr *pEVar28;
  int iVar29;
  int iVar30;
  RenameToken *pRVar31;
  Schema **ppSVar32;
  char *pcVar33;
  Window *p2;
  char *pcVar34;
  uint uVar35;
  uint uVar36;
  SrcList_item *pSVar37;
  char *pcVar38;
  uint uVar39;
  char *zLeft;
  Schema *pSVar40;
  Column *pCVar41;
  char **ppcVar42;
  long lVar43;
  Table *pTVar44;
  NameContext *pNVar45;
  long lVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  Walker w;
  u8 local_109;
  NameContext *local_f8;
  char *local_f0;
  int local_e8;
  SrcList_item *local_c0;
  int *local_a8;
  Table **local_a0;
  int local_90;
  sqlite3 *local_88;
  SrcList *local_70;
  undefined8 local_68;
  Walker local_60;
  
  pNVar6 = (pWalker->u).pNC;
  pParse = pNVar6->pParse;
  bVar3 = pExpr->op;
  if (0x82 < bVar3) {
    if (bVar3 < 0x94) {
      if (bVar3 == 0x83) goto switchD_00171080_caseD_31;
      if (bVar3 != 0x86) goto switchD_00171080_caseD_2e;
      pEVar28 = pExpr->pLeft;
      notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar6->ncFlags,"the \".\" operator",0x20);
      pEVar22 = pExpr->pRight;
      if (pEVar22->op == ';') {
        pcVar34 = (char *)0x0;
      }
      else {
        pcVar34 = (pEVar28->u).zToken;
        pEVar28 = pEVar22->pLeft;
        pEVar22 = pEVar22->pRight;
      }
      pcVar33 = (pEVar28->u).zToken;
      local_f0 = (pEVar22->u).zToken;
      if ((1 < pParse->eParseMode) &&
         (pRVar24 = pParse->pRename, pRVar31 = pRVar24, pRVar24 != (RenameToken *)0x0)) {
        do {
          if ((Expr *)pRVar31->p == pEVar22) {
            pRVar31->p = pExpr;
            pRVar24 = pParse->pRename;
            break;
          }
          ppRVar1 = &pRVar31->pNext;
          pRVar31 = *ppRVar1;
        } while (*ppRVar1 != (RenameToken *)0x0);
        if (pRVar24 != (RenameToken *)0x0) {
          do {
            if ((Expr *)pRVar24->p == pEVar28) {
              pRVar24->p = &pExpr->y;
              break;
            }
            pRVar24 = pRVar24->pNext;
          } while (pRVar24 != (RenameToken *)0x0);
        }
      }
      local_88 = pParse->db;
      pExpr->iTable = -1;
      if (pcVar34 == (char *)0x0) {
        pcVar34 = (char *)0x0;
LAB_0017165d:
        pSVar40 = (Schema *)0x0;
      }
      else if ((pNVar6->ncFlags & 6) == 0) {
        iVar16 = local_88->nDb;
        if ((long)iVar16 < 1) goto LAB_0017165d;
        pDVar9 = local_88->aDb;
        lVar46 = 0;
        do {
          iVar30 = sqlite3StrICmp(*(char **)((long)&pDVar9->zDbSName + lVar46),pcVar34);
          if (iVar30 == 0) {
            pSVar40 = *(Schema **)((long)&pDVar9->pSchema + lVar46);
            goto LAB_001716be;
          }
          lVar46 = lVar46 + 0x20;
        } while ((long)iVar16 * 0x20 != lVar46);
        pSVar40 = (Schema *)0x0;
      }
      else {
        pSVar40 = (Schema *)0x0;
        pcVar34 = (char *)0x0;
      }
LAB_001716be:
      local_a8 = &pExpr->iTable;
      local_a0 = &pParse->pTriggerTab;
      local_c0 = (SrcList_item *)0x0;
      local_109 = 0xa2;
      local_e8 = -1;
      local_90 = 0;
      iVar16 = 0;
      local_f8 = pNVar6;
      do {
        pSVar10 = local_f8->pSrcList;
        if (pSVar10 == (SrcList *)0x0) {
          iVar30 = 0;
        }
        else {
          iVar20 = pSVar10->nSrc;
          if (iVar20 < 1) {
            iVar30 = 0;
          }
          else {
            pSVar37 = pSVar10->a;
            iVar29 = 0;
            iVar30 = 0;
            do {
              pTVar44 = pSVar37->pTab;
              pSVar23 = pSVar37->pSelect;
              if ((pSVar23 == (Select *)0x0) || ((pSVar23->selFlags & 0x800) == 0)) {
LAB_00171811:
                if ((pcVar34 == (char *)0x0) || (pTVar44->pSchema == pSVar40)) {
                  if (pcVar33 != (char *)0x0) {
                    pcVar38 = pSVar37->zAlias;
                    zLeft = pcVar38;
                    if (pcVar38 == (char *)0x0) {
                      zLeft = pTVar44->zName;
                    }
                    iVar17 = sqlite3StrICmp(zLeft,pcVar33);
                    if (iVar17 != 0) goto LAB_001719b1;
                    if ((pcVar38 != (char *)0x0) && (1 < pParse->eParseMode)) {
                      for (pRVar24 = pParse->pRename; pRVar24 != (RenameToken *)0x0;
                          pRVar24 = pRVar24->pNext) {
                        if ((anon_union_8_3_c79b3df9_for_y *)pRVar24->p == &pExpr->y) {
                          pRVar24->p = (void *)0x0;
                          break;
                        }
                      }
                    }
                  }
                  iVar17 = iVar16 + 1;
                  if (iVar16 == 0) {
                    local_c0 = pSVar37;
                  }
                  sVar5 = pTVar44->nCol;
                  iVar16 = iVar17;
                  if (0 < sVar5) {
                    pCVar41 = pTVar44->aCol;
                    iVar17 = 0;
                    do {
                      iVar18 = sqlite3StrICmp(pCVar41->zName,local_f0);
                      if (iVar18 == 0) {
                        if (iVar30 != 1) {
LAB_0017196e:
                          iVar30 = iVar30 + 1;
                          if (iVar17 == pTVar44->iPKey) {
                            iVar17 = 0xffff;
                          }
                          pExpr->iColumn = (ynVar)iVar17;
                          local_c0 = pSVar37;
                          break;
                        }
                        if (((pSVar37->fg).jointype & 4) == 0) {
                          pIVar11 = pSVar37->pUsing;
                          if ((pIVar11 == (IdList *)0x0) ||
                             (iVar18 = pIVar11->nId, (long)iVar18 < 1)) goto LAB_0017196e;
                          pIVar12 = pIVar11->a;
                          lVar46 = 0;
                          while (iVar19 = sqlite3StrICmp(*(char **)((long)&pIVar12->zName + lVar46),
                                                         local_f0), iVar19 != 0) {
                            lVar46 = lVar46 + 0x10;
                            if ((long)iVar18 * 0x10 == lVar46) goto LAB_0017196e;
                          }
                        }
                      }
                      iVar17 = iVar17 + 1;
                      pCVar41 = pCVar41 + 1;
                    } while (iVar17 != sVar5);
                  }
                }
              }
              else {
                lVar46 = (long)pSVar23->pEList->nExpr;
                bVar50 = false;
                if (0 < lVar46) {
                  ppcVar42 = &pSVar23->pEList->a[0].zSpan;
                  lVar43 = 0;
                  do {
                    iVar17 = sqlite3MatchSpanName(*ppcVar42,local_f0,pcVar33,pcVar34);
                    if (iVar17 != 0) {
                      iVar30 = iVar30 + 1;
                      pExpr->iColumn = (ynVar)lVar43;
                      iVar16 = 2;
                      bVar50 = true;
                      local_c0 = pSVar37;
                    }
                    lVar43 = lVar43 + 1;
                    ppcVar42 = ppcVar42 + 4;
                  } while (lVar46 != lVar43);
                }
                if (pcVar33 != (char *)0x0 && !bVar50) goto LAB_00171811;
              }
LAB_001719b1:
              iVar29 = iVar29 + 1;
              pSVar37 = pSVar37 + 1;
            } while (iVar29 != iVar20);
          }
          if (local_c0 == (SrcList_item *)0x0) {
            local_c0 = (SrcList_item *)0x0;
          }
          else {
            local_e8 = local_c0->iCursor;
            *local_a8 = local_e8;
            pTVar44 = local_c0->pTab;
            (pExpr->y).pTab = pTVar44;
            if (((local_c0->fg).jointype & 8) != 0) {
              pbVar2 = (byte *)((long)&pExpr->flags + 2);
              *pbVar2 = *pbVar2 | 0x10;
            }
            pSVar40 = pTVar44->pSchema;
          }
        }
        if (iVar16 == 0 && (pcVar33 != (char *)0x0 && pcVar34 == (char *)0x0)) {
          pTVar44 = *local_a0;
          if (pTVar44 == (Table *)0x0) {
            pTVar44 = (Table *)0x0;
          }
          else {
            uVar15 = pParse->eTriggerOp;
            if (uVar15 == 'y') {
LAB_00171a87:
              iVar20 = sqlite3StrICmp("old",pcVar33);
              iVar16 = 0;
              if (iVar20 != 0) {
                pTVar44 = (Table *)0x0;
                goto LAB_00171ac9;
              }
            }
            else {
              iVar16 = sqlite3StrICmp("new",pcVar33);
              if (iVar16 != 0) {
                if (uVar15 == 'x') {
                  pTVar44 = (Table *)0x0;
                  goto LAB_00171ac9;
                }
                goto LAB_00171a87;
              }
              iVar16 = 1;
            }
            local_e8 = iVar16;
            *local_a8 = local_e8;
          }
LAB_00171ac9:
          if ((((local_f8->ncFlags & 0x200) != 0) &&
              (pUVar13 = (local_f8->uNC).pUpsert, pUVar13 != (Upsert *)0x0)) &&
             (iVar16 = sqlite3StrICmp("excluded",pcVar33), iVar16 == 0)) {
            pTVar44 = pUVar13->pUpsertSrc->a[0].pTab;
            *local_a8 = 2;
            local_e8 = 2;
          }
          if (pTVar44 != (Table *)0x0) {
            pSVar40 = pTVar44->pSchema;
            uVar39 = (uint)pTVar44->nCol;
            if (pTVar44->nCol < 1) {
              uVar36 = 0;
LAB_00171b6d:
              if ((int)uVar39 <= (int)uVar36) goto LAB_00171b71;
            }
            else {
              pCVar41 = pTVar44->aCol;
              uVar35 = 0;
              do {
                iVar16 = sqlite3StrICmp(pCVar41->zName,local_f0);
                if (iVar16 == 0) {
                  uVar36 = uVar35;
                  if ((int)pTVar44->iPKey == uVar35) {
                    uVar36 = 0xffffffff;
                  }
                  goto LAB_00171b6d;
                }
                uVar35 = uVar35 + 1;
                pCVar41 = pCVar41 + 1;
                uVar36 = uVar39;
              } while (uVar39 != uVar35);
LAB_00171b71:
              iVar16 = sqlite3IsRowid(local_f0);
              if (iVar16 != 0) {
                uVar36 = uVar36 | -(uint)((pTVar44->tabFlags & 0x40) == 0);
              }
            }
            if ((int)uVar36 < (int)uVar39) {
              iVar30 = iVar30 + 1;
              if (local_e8 == 2) {
                if (pParse->eParseMode < 2) {
                  local_e8 = uVar36 + ((local_f8->uNC).pUpsert)->regData;
                  pExpr->iTable = local_e8;
                  pbVar2 = (byte *)((long)&pExpr->flags + 2);
                  *pbVar2 = *pbVar2 | 0x40;
                  local_109 = 0xa8;
                }
                else {
                  pExpr->iColumn = (ynVar)uVar36;
                  (pExpr->y).pTab = pTVar44;
                  local_109 = 0xa2;
                  local_e8 = 2;
                }
              }
              else {
                if ((int)uVar36 < 0) {
                  pExpr->affinity = 'D';
                }
                else {
                  uVar39 = 1 << ((byte)uVar36 & 0x1f);
                  if (0x1f < uVar36) {
                    uVar39 = 0xffffffff;
                  }
                  if (local_e8 == 0) {
                    pParse->oldmask = pParse->oldmask | uVar39;
                  }
                  else {
                    pParse->newmask = pParse->newmask | uVar39;
                  }
                }
                (pExpr->y).pTab = pTVar44;
                pExpr->iColumn = (ynVar)uVar36;
                local_109 = 'M';
              }
            }
            iVar16 = 1;
            goto LAB_00171c52;
          }
          iVar16 = 0;
LAB_00171d26:
          if (iVar30 != 0) {
            if (iVar30 != 1) {
              pcVar38 = "ambiguous column name";
              goto LAB_00171e75;
            }
LAB_00171db4:
            bVar50 = true;
            goto LAB_00171f32;
          }
        }
        else {
LAB_00171c52:
          uVar4 = local_f8->ncFlags;
          if ((((iVar30 == 0) && (iVar16 == 1)) &&
              ((local_c0 != (SrcList_item *)0x0 &&
               ((iVar16 = 1, (uVar4 & 0x20) == 0 && (iVar20 = sqlite3IsRowid(local_f0), iVar20 != 0)
                ))))) && ((local_c0->pTab->tabFlags & 0x40) == 0)) {
            pExpr->iColumn = -1;
            pExpr->affinity = 'D';
            goto LAB_00171db4;
          }
          if (((pcVar33 != (char *)0x0) || (iVar30 != 0)) || ((uVar4 & 0x80) == 0))
          goto LAB_00171d26;
          pEVar7 = (local_f8->uNC).pEList;
          iVar30 = pEVar7->nExpr;
          if (0 < (long)iVar30) {
            ppcVar42 = &pEVar7->a[0].zName;
            lVar46 = 0;
            do {
              pcVar38 = *ppcVar42;
              if ((pcVar38 != (char *)0x0) &&
                 (iVar20 = sqlite3StrICmp(pcVar38,local_f0), iVar20 == 0)) {
                pEVar28 = ((ExprList_item *)(ppcVar42 + -1))->pExpr;
                if (((uVar4 & 1) == 0) && ((pEVar28->flags & 0x10) != 0)) {
                  pcVar34 = "misuse of aliased aggregate %s";
LAB_00171e55:
                  sqlite3ErrorMsg(pParse,pcVar34,pcVar38);
                  return 2;
                }
                if (((uVar4 >> 0xe & 1) == 0) && ((pEVar28->flags & 0x8000) != 0)) {
                  pcVar34 = "misuse of aliased window function %s";
                  goto LAB_00171e55;
                }
                uVar15 = pEVar28->op;
                if (uVar15 == 0xa8) {
                  uVar15 = pEVar28->op2;
                }
                if (uVar15 == 0x83) {
                  pSVar23 = (pEVar28->x).pSelect;
LAB_00171dd5:
                  if (((anon_union_8_2_a01b6dbf_for_x *)&pSVar23->pEList)->pList->nExpr != 1) {
                    sqlite3ErrorMsg(pParse,"row value misused");
                    return 2;
                  }
                }
                else if (uVar15 == 0xa9) {
                  pSVar23 = (Select *)&pEVar28->x;
                  goto LAB_00171dd5;
                }
                resolveAlias(pParse,pEVar7,(int)lVar46,pExpr,"",local_90);
                if ((pParse->eParseMode < 2) ||
                   (pRVar24 = pParse->pRename, pRVar24 == (RenameToken *)0x0)) goto LAB_00171fc4;
                goto LAB_00171e24;
              }
              lVar46 = lVar46 + 1;
              ppcVar42 = ppcVar42 + 4;
            } while (iVar30 != lVar46);
          }
        }
        local_f8 = local_f8->pNext;
        local_90 = local_90 + 1;
      } while (local_f8 != (NameContext *)0x0);
      pcVar38 = "no such column";
      if (pcVar33 == (char *)0x0) {
        if ((pExpr->flags & 0x40) != 0) {
          sqlite3_log(0x1c,"double-quoted string literal: \"%w\"",local_f0);
          pExpr->op = 'n';
          (pExpr->y).pTab = (Table *)0x0;
          return 1;
        }
        iVar16 = sqlite3ExprIdToTrueFalse(pExpr);
        if (iVar16 != 0) {
          return 1;
        }
        local_f8 = (NameContext *)0x0;
      }
      else {
        local_f8 = (NameContext *)0x0;
      }
LAB_00171e75:
      if (pcVar34 == (char *)0x0) {
        if (pcVar33 == (char *)0x0) {
          sqlite3ErrorMsg(pParse,"%s: %s",pcVar38,local_f0);
        }
        else {
          sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar38,pcVar33,local_f0);
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar38,pcVar34,pcVar33,local_f0);
      }
      pParse->checkSchema = '\x01';
      pNVar6->nErr = pNVar6->nErr + 1;
      bVar50 = false;
LAB_00171f32:
      uVar4 = pExpr->iColumn;
      if ((-1 < (short)uVar4) && (local_c0 != (SrcList_item *)0x0)) {
        uVar26 = 0x3f;
        if (uVar4 < 0x3f) {
          uVar26 = uVar4;
        }
        local_c0->colUsed = local_c0->colUsed | 1L << ((byte)uVar26 & 0x3f);
      }
      if (pExpr->pLeft != (Expr *)0x0) {
        sqlite3ExprDeleteNN(local_88,pExpr->pLeft);
      }
      pExpr->pLeft = (Expr *)0x0;
      if (pExpr->pRight != (Expr *)0x0) {
        sqlite3ExprDeleteNN(local_88,pExpr->pRight);
      }
      pExpr->pRight = (Expr *)0x0;
      pExpr->op = local_109;
      pbVar2 = (byte *)((long)&pExpr->flags + 2);
      *pbVar2 = *pbVar2 | 0x80;
      if (!bVar50) {
        return 2;
      }
LAB_00171fc4:
      if ((((pExpr->flags & 0x400000) == 0) && (pSVar40 != (Schema *)0x0)) &&
         (pParse->db->xAuth != (sqlite3_xauth)0x0)) {
        iVar16 = -1;
        ppSVar32 = &pParse->db->aDb->pSchema;
        do {
          iVar16 = iVar16 + 1;
          pSVar14 = *ppSVar32;
          ppSVar32 = ppSVar32 + 4;
        } while (pSVar14 != pSVar40);
        if (pExpr->op == 'M') {
LAB_00172021:
          pTVar44 = *local_a0;
          if (pTVar44 != (Table *)0x0) {
            lVar46 = (long)pExpr->iColumn;
            if ((pExpr->iColumn < 0) && (lVar46 = (long)pTVar44->iPKey, lVar46 < 0)) {
              pcVar34 = "ROWID";
            }
            else {
              pcVar34 = pTVar44->aCol[lVar46].zName;
            }
            iVar16 = sqlite3AuthReadCol(pParse,pTVar44->zName,pcVar34,iVar16);
            if (iVar16 == 2) {
              pExpr->op = 'r';
            }
          }
        }
        else {
          lVar46 = (long)local_f8->pSrcList->nSrc;
          if (0 < lVar46) {
            local_a0 = &local_f8->pSrcList->a[0].pTab;
            do {
              if (*local_a8 == *(int *)(local_a0 + 4)) goto LAB_00172021;
              local_a0 = local_a0 + 0xe;
              lVar46 = lVar46 + -1;
            } while (lVar46 != 0);
          }
        }
      }
      pNVar6->nRef = pNVar6->nRef + 1;
      while (local_f8 != pNVar6) {
        pNVar6 = pNVar6->pNext;
        pNVar6->nRef = pNVar6->nRef + 1;
      }
      return 1;
    }
    if (bVar3 == 0x94) {
      notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar6->ncFlags,"parameters",0x26);
      goto switchD_00171080_caseD_2e;
    }
    if (bVar3 == 0xa0) goto switchD_00171080_caseD_2d;
    if (bVar3 != 0xa1) goto switchD_00171080_caseD_2e;
    pEVar7 = (pExpr->x).pList;
    uVar27 = 0;
    iVar16 = 0;
    if (pEVar7 != (ExprList *)0x0) {
      iVar16 = pEVar7->nExpr;
    }
    db = pParse->db;
    uVar15 = db->enc;
    uVar4 = pNVar6->ncFlags;
    pcVar34 = (pExpr->u).zToken;
    if (pcVar34 != (char *)0x0) {
      sVar21 = strlen(pcVar34);
      uVar27 = (ulong)((uint)sVar21 & 0x3fffffff);
    }
    pFunc = sqlite3FindFunction(db,pcVar34,iVar16,uVar15,'\0');
    if (pFunc == (FuncDef *)0x0) {
      bVar47 = false;
      pFunc = sqlite3FindFunction(pParse->db,pcVar34,-2,uVar15,'\0');
      bVar48 = pFunc == (FuncDef *)0x0;
      bVar50 = !bVar48;
      if (1 < pParse->eParseMode) goto LAB_0017230e;
LAB_001715a3:
      if (((pFunc != (FuncDef *)0x0) && (pFunc->xValue == (_func_void_sqlite3_context_ptr *)0x0)) &&
         ((pExpr->flags & 0x1000000) != 0)) {
        pcVar33 = "%.*s() may not be used as a window function";
        goto LAB_0017218a;
      }
      if (bVar47) {
        if ((pNVar6->ncFlags & 1) != 0) {
          if ((pFunc->funcFlags >> 0x10 & 1) == 0) {
            bVar49 = (pExpr->y).pTab != (Table *)0x0;
          }
          else {
            bVar49 = true;
            if ((pExpr->y).pTab == (Table *)0x0) goto LAB_00172126;
          }
          if (!bVar49 || ((byte)(pNVar6->ncFlags >> 0xe) & 1) != 0) goto LAB_00172151;
        }
LAB_00172126:
        if ((pFunc->funcFlags >> 0x10 & 1) == 0) {
          pcVar33 = "window";
          if ((pExpr->y).pTab == (Table *)0x0) {
            pcVar33 = "aggregate";
          }
        }
        else {
          pcVar33 = "window";
        }
        sqlite3ErrorMsg(pParse,"misuse of %s function %.*s()",pcVar33,uVar27,pcVar34);
        pNVar6->nErr = pNVar6->nErr + 1;
        goto LAB_0017230e;
      }
LAB_00172151:
      if (bVar50) {
        if (!bVar48) {
          pcVar33 = "wrong number of arguments to function %.*s()";
LAB_0017218a:
          sqlite3ErrorMsg(pParse,pcVar33,uVar27,pcVar34);
          pNVar6->nErr = pNVar6->nErr + 1;
        }
      }
      else {
        bVar50 = (pParse->db->init).busy != '\0';
        pcVar33 = "no such function: %.*s";
        if (bVar50) {
          pcVar33 = "wrong number of arguments to function %.*s()";
        }
        if (!(bool)(bVar50 & bVar48)) goto LAB_0017218a;
      }
      if (!bVar47) {
LAB_0017230e:
        sqlite3WalkExprList(pWalker,pEVar7);
        return 1;
      }
      pNVar6->ncFlags = pNVar6->ncFlags & 0xbfff - ((pExpr->y).pTab == (Table *)0x0);
      sqlite3WalkExprList(pWalker,pEVar7);
    }
    else {
      p_Var8 = pFunc->xFinalize;
      bVar47 = p_Var8 != (_func_void_sqlite3_context_ptr *)0x0;
      if ((pFunc->funcFlags & 0x400) != 0) {
        pExpr->flags = pExpr->flags | 0x41000;
        if (iVar16 == 2) {
          iVar16 = exprProbability(*(Expr **)(pEVar7 + 1));
          pExpr->iTable = iVar16;
          if (iVar16 < 0) {
            sqlite3ErrorMsg(pParse,
                            "second argument to likelihood() must be a constant between 0.0 and 1.0"
                           );
            pNVar6->nErr = pNVar6->nErr + 1;
          }
        }
        else {
          iVar16 = 0x7800000;
          if (*pFunc->zName == 'u') {
            iVar16 = 0x800000;
          }
          pExpr->iTable = iVar16;
        }
      }
      iVar16 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFunc->zName,(char *)0x0);
      if (iVar16 != 0) {
        if (iVar16 == 1) {
          sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFunc->zName);
          pNVar6->nErr = pNVar6->nErr + 1;
        }
        pExpr->op = 'r';
        return 1;
      }
      uVar39 = pFunc->funcFlags;
      if ((uVar39 & 0x2800) != 0) {
        pbVar2 = (byte *)((long)&pExpr->flags + 2);
        *pbVar2 = *pbVar2 | 8;
      }
      if ((uVar39 >> 0xb & 1) == 0) {
        notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar6->ncFlags,
                 "non-deterministic functions",0x22);
        uVar39 = pFunc->funcFlags;
      }
      bVar48 = true;
      bVar50 = true;
      if (((uVar39 >> 0x12 & 1) != 0) &&
         (bVar49 = pParse->nested != '\0', bVar50 = sqlite3Config.bInternalFunctions != 0 || bVar49,
         sqlite3Config.bInternalFunctions == 0 && !bVar49)) {
        pFunc = (FuncDef *)0x0;
      }
      if (pParse->eParseMode < 2) goto LAB_001715a3;
      sqlite3WalkExprList(pWalker,pEVar7);
      if (p_Var8 == (_func_void_sqlite3_context_ptr *)0x0) {
        return 1;
      }
    }
    if ((pExpr->y).pWin == (Window *)0x0) {
      pExpr->op = 0xa3;
      pExpr->op2 = '\0';
      pNVar45 = pNVar6;
      do {
        local_70 = pNVar45->pSrcList;
        local_60.xExprCallback = exprSrcCount;
        local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        local_68 = 0;
        local_60.u.pNC = (NameContext *)&local_70;
        sqlite3WalkExprList(&local_60,(pExpr->x).pList);
        if ((0 < (int)local_68) || (local_68._4_4_ == 0)) {
          pNVar45->ncFlags = (ushort)pFunc->funcFlags & 0x1000 | pNVar45->ncFlags | 0x10;
          break;
        }
        pExpr->op2 = pExpr->op2 + '\x01';
        pNVar45 = pNVar45->pNext;
      } while (pNVar45 != (NameContext *)0x0);
      goto LAB_00172345;
    }
    pSVar23 = pNVar6->pWinSelect;
    sqlite3WindowUpdate(pParse,pSVar23->pWinDefn,(pExpr->y).pWin,pFunc);
    sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pPartition);
    sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pOrderBy);
    p2 = (pExpr->y).pWin;
    if (p2->pFilter != (Expr *)0x0) {
      walkExpr(pWalker,p2->pFilter);
      p2 = (pExpr->y).pWin;
    }
    if (pSVar23->pWin == (Window *)0x0) {
      pWVar25 = (Window *)0x0;
LAB_00172317:
      p2->pNextWin = pWVar25;
      pSVar23->pWin = (Window *)pExpr->y;
    }
    else {
      iVar16 = sqlite3WindowCompare(pParse,pSVar23->pWin,p2);
      if (iVar16 == 0) {
        pWVar25 = pSVar23->pWin;
        p2 = (pExpr->y).pWin;
        goto LAB_00172317;
      }
    }
    pbVar2 = (byte *)((long)&pNVar6->ncFlags + 1);
    *pbVar2 = *pbVar2 | 0x80;
LAB_00172345:
    pNVar6->ncFlags = pNVar6->ncFlags | uVar4 & 0x4001;
    return 1;
  }
  switch(bVar3) {
  case 0x2d:
    goto switchD_00171080_caseD_2d;
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x3a:
    goto switchD_00171080_caseD_2e;
  case 0x30:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_00171080_caseD_30;
  case 0x31:
    goto switchD_00171080_caseD_31;
  case 0x3b:
    local_f0 = (pExpr->u).zToken;
    local_88 = pParse->db;
    pExpr->iTable = -1;
    pcVar33 = (char *)0x0;
    pSVar40 = (Schema *)0x0;
    pcVar34 = (char *)0x0;
    goto LAB_001716be;
  default:
    if (bVar3 != 0x14) goto switchD_00171080_caseD_2e;
    goto switchD_00171080_caseD_31;
  }
  while (pRVar24 = pRVar24->pNext, pRVar24 != (RenameToken *)0x0) {
LAB_00171e24:
    if ((Expr *)pRVar24->p == pExpr) {
      pRVar24->p = (void *)0x0;
      break;
    }
  }
  goto LAB_00171fc4;
switchD_00171080_caseD_31:
  if ((pExpr->flags & 0x800) != 0) {
    iVar16 = pNVar6->nRef;
    notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar6->ncFlags,"subqueries",0x26);
    sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
    if (iVar16 != pNVar6->nRef) {
      *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
      *(byte *)&pNVar6->ncFlags = (byte)pNVar6->ncFlags | 0x40;
    }
  }
  goto switchD_00171080_caseD_2e;
switchD_00171080_caseD_2d:
  pEVar28 = pExpr->pRight;
  if (pEVar28->op == ';') {
    iVar16 = resolveExprStep(pWalker,pEVar28);
    if (iVar16 == 2) {
      return 2;
    }
    if (pEVar28->op == 0x9f) {
      pExpr->op2 = pExpr->op;
      pExpr->op = 0xa7;
      return 0;
    }
  }
switchD_00171080_caseD_30:
  if (pParse->db->mallocFailed != '\0') goto switchD_00171080_caseD_2e;
  pEVar28 = pExpr->pLeft;
  uVar15 = pEVar28->op;
  if (uVar15 == 0xa8) {
    uVar15 = pEVar28->op2;
  }
  if (uVar15 == 0x83) {
    pSVar23 = (pEVar28->x).pSelect;
LAB_001712db:
    iVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar23->pEList)->pList->nExpr;
  }
  else {
    iVar16 = 1;
    if (uVar15 == 0xa9) {
      pSVar23 = (Select *)&pEVar28->x;
      goto LAB_001712db;
    }
  }
  if (pExpr->op == '0') {
    pEVar28 = ((pExpr->x).pList)->a[0].pExpr;
    uVar15 = pEVar28->op;
    if (uVar15 == 0xa8) {
      uVar15 = pEVar28->op2;
    }
    if (uVar15 == 0x83) {
      pSVar23 = (pEVar28->x).pSelect;
LAB_00171376:
      iVar30 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar23->pEList)->pList->nExpr;
    }
    else {
      iVar30 = 1;
      if (uVar15 == 0xa9) {
        pSVar23 = (Select *)&pEVar28->x;
        goto LAB_00171376;
      }
    }
    if (iVar30 == iVar16) {
      pEVar28 = *(Expr **)((pExpr->x).pList + 1);
      goto LAB_00171383;
    }
  }
  else {
    pEVar28 = pExpr->pRight;
LAB_00171383:
    uVar15 = pEVar28->op;
    if (uVar15 == 0xa8) {
      uVar15 = pEVar28->op2;
    }
    if (uVar15 == 0x83) {
      pSVar23 = (pEVar28->x).pSelect;
    }
    else {
      iVar30 = 1;
      if (uVar15 != 0xa9) goto LAB_001713b1;
      pSVar23 = (Select *)&pEVar28->x;
    }
    iVar30 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar23->pEList)->pList->nExpr;
  }
LAB_001713b1:
  if (iVar16 != iVar30) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
switchD_00171080_caseD_2e:
  iVar16 = 2;
  if (pParse->nErr == 0) {
    iVar16 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar16;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a;
      assert( HasRowid(pItem->pTab) && pItem->pTab->pSelect==0 );
      pExpr->op = TK_COLUMN;
      pExpr->y.pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        Expr *pLeft = pExpr->pLeft;
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pLeft->u.zToken;
          pLeft = pRight->pLeft;
          pRight = pRight->pRight;
        }
        zTable = pLeft->u.zToken;
        zColumn = pRight->u.zToken;
        if( IN_RENAME_OBJECT ){
          sqlite3RenameTokenRemap(pParse, (void*)pExpr, (void*)pRight);
          sqlite3RenameTokenRemap(pParse, (void*)&pExpr->y.pTab, (void*)pLeft);
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */
      int savedAllowFlags = (pNC->ncFlags & (NC_AllowAgg | NC_AllowWin));

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely|EP_Skip);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_INTERNAL)!=0
         && pParse->nested==0
         && sqlite3Config.bInternalFunctions==0
        ){
          /* Internal-use-only functions are disallowed unless the
          ** SQL is being compiled using sqlite3NestedParse() */
          no_such_func = 1;
          pDef = 0;
        }
      }

      if( 0==IN_RENAME_OBJECT ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        assert( is_agg==0 || (pDef->funcFlags & SQLITE_FUNC_MINMAX)
          || (pDef->xValue==0 && pDef->xInverse==0)
          || (pDef->xValue && pDef->xInverse && pDef->xSFunc && pDef->xFinalize)
        );
        if( pDef && pDef->xValue==0 && ExprHasProperty(pExpr, EP_WinFunc) ){
          sqlite3ErrorMsg(pParse, 
              "%.*s() may not be used as a window function", nId, zId
          );
          pNC->nErr++;
        }else if( 
              (is_agg && (pNC->ncFlags & NC_AllowAgg)==0)
           || (is_agg && (pDef->funcFlags&SQLITE_FUNC_WINDOW) && !pExpr->y.pWin)
           || (is_agg && pExpr->y.pWin && (pNC->ncFlags & NC_AllowWin)==0)
        ){
          const char *zType;
          if( (pDef->funcFlags & SQLITE_FUNC_WINDOW) || pExpr->y.pWin ){
            zType = "window";
          }else{
            zType = "aggregate";
          }
          sqlite3ErrorMsg(pParse, "misuse of %s function %.*s()",zType,nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#else
        if( (is_agg && (pNC->ncFlags & NC_AllowAgg)==0) ){
          sqlite3ErrorMsg(pParse,"misuse of aggregate function %.*s()",nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#endif
        else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                  && pParse->explain==0
#endif
        ){
          sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
          pNC->nErr++;
        }else if( wrong_num_args ){
          sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
               nId, zId);
          pNC->nErr++;
        }
        if( is_agg ){
          /* Window functions may not be arguments of aggregate functions.
          ** Or arguments of other window functions. But aggregate functions
          ** may be arguments for window functions.  */
#ifndef SQLITE_OMIT_WINDOWFUNC
          pNC->ncFlags &= ~(NC_AllowWin | (!pExpr->y.pWin ? NC_AllowAgg : 0));
#else
          pNC->ncFlags &= ~NC_AllowAgg;
#endif
        }
      }
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( pExpr->y.pWin ){
          Select *pSel = pNC->pWinSelect;
          sqlite3WindowUpdate(pParse, pSel->pWinDefn, pExpr->y.pWin, pDef);
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pPartition);
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pOrderBy);
          sqlite3WalkExpr(pWalker, pExpr->y.pWin->pFilter);
          if( 0==pSel->pWin 
           || 0==sqlite3WindowCompare(pParse, pSel->pWin, pExpr->y.pWin) 
          ){
            pExpr->y.pWin->pNextWin = pSel->pWin;
            pSel->pWin = pExpr->y.pWin;
          }
          pNC->ncFlags |= NC_HasWin;
        }else
#endif /* SQLITE_OMIT_WINDOWFUNC */
        {
          NameContext *pNC2 = pNC;
          pExpr->op = TK_AGG_FUNCTION;
          pExpr->op2 = 0;
          while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
            pExpr->op2++;
            pNC2 = pNC2->pNext;
          }
          assert( pDef!=0 );
          if( pNC2 ){
            assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
            testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
            pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

          }
        }
        pNC->ncFlags |= savedAllowFlags;
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      Expr *pRight;
      assert( !ExprHasProperty(pExpr, EP_Reduced) );
      /* Handle special cases of "x IS TRUE", "x IS FALSE", "x IS NOT TRUE",
      ** and "x IS NOT FALSE". */
      if( (pRight = pExpr->pRight)->op==TK_ID ){
        int rc = resolveExprStep(pWalker, pRight);
        if( rc==WRC_Abort ) return WRC_Abort;
        if( pRight->op==TK_TRUEFALSE ){
          pExpr->op2 = pExpr->op;
          pExpr->op = TK_TRUTH;
          return WRC_Continue;
        }
      }
      /* Fall thru */
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}